

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong unaff_R12;
  size_t mask;
  int iVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  ulong local_1480;
  int local_1474;
  RTCIntersectArguments *local_1470;
  ulong local_1468;
  ulong local_1460;
  ulong local_1458;
  ulong local_1450;
  Scene *scene;
  Geometry *local_1440;
  ulong local_1438;
  ulong local_1430;
  ulong local_1428;
  NodeRef *local_1420;
  RayQueryContext *local_1418;
  ulong local_1410;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  byte local_1347;
  float local_1338 [4];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    if (0.0 <= ray->tfar) {
      local_1420 = stack + 1;
      aVar3 = (ray->dir).field_0.field_1;
      auVar26 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      auVar24 = vandps_avx512vl((undefined1  [16])aVar3,auVar24);
      auVar35._8_4_ = 0x219392ef;
      auVar35._0_8_ = 0x219392ef219392ef;
      auVar35._12_4_ = 0x219392ef;
      uVar16 = vcmpps_avx512vl(auVar24,auVar35,1);
      bVar23 = (bool)((byte)uVar16 & 1);
      auVar36._0_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * (int)aVar3.x;
      bVar23 = (bool)((byte)(uVar16 >> 1) & 1);
      auVar36._4_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * (int)aVar3.y;
      bVar23 = (bool)((byte)(uVar16 >> 2) & 1);
      auVar36._8_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * (int)aVar3.z;
      bVar23 = (bool)((byte)(uVar16 >> 3) & 1);
      auVar36._12_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * aVar3.field_3.a;
      auVar24 = vrcp14ps_avx512vl(auVar36);
      auVar25._8_4_ = 0x3f800000;
      auVar25._0_8_ = &DAT_3f8000003f800000;
      auVar25._12_4_ = 0x3f800000;
      auVar25 = vfnmadd213ps_avx512vl(auVar36,auVar24,auVar25);
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar36 = vfmadd132ps_fma(auVar25,auVar24,auVar24);
      auVar37 = vbroadcastss_avx512vl(auVar36);
      auVar53 = ZEXT3264(auVar37);
      auVar24 = vmovshdup_avx(auVar36);
      auVar37 = vbroadcastsd_avx512vl(auVar24);
      auVar54 = ZEXT3264(auVar37);
      auVar25 = vshufpd_avx(auVar36,auVar36,1);
      auVar38._8_4_ = 2;
      auVar38._0_8_ = 0x200000002;
      auVar38._12_4_ = 2;
      auVar38._16_4_ = 2;
      auVar38._20_4_ = 2;
      auVar38._24_4_ = 2;
      auVar38._28_4_ = 2;
      auVar37 = vpermps_avx512vl(auVar38,ZEXT1632(auVar36));
      auVar55 = ZEXT3264(auVar37);
      fVar41 = auVar36._0_4_ * (ray->org).field_0.m128[0];
      auVar46._4_4_ = fVar41;
      auVar46._0_4_ = fVar41;
      auVar46._8_4_ = fVar41;
      auVar46._12_4_ = fVar41;
      auVar46._16_4_ = fVar41;
      auVar46._20_4_ = fVar41;
      auVar46._24_4_ = fVar41;
      auVar46._28_4_ = fVar41;
      auVar37._8_4_ = 1;
      auVar37._0_8_ = 0x100000001;
      auVar37._12_4_ = 1;
      auVar37._16_4_ = 1;
      auVar37._20_4_ = 1;
      auVar37._24_4_ = 1;
      auVar37._28_4_ = 1;
      auVar39 = ZEXT1632(CONCAT412(auVar36._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar36._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar36._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar41))));
      auVar37 = vpermps_avx2(auVar37,auVar39);
      auVar39 = vpermps_avx2(auVar38,auVar39);
      local_1428 = (ulong)(auVar36._0_4_ < 0.0) << 5;
      local_1430 = (ulong)(auVar24._0_4_ < 0.0) << 5 | 0x40;
      uVar16 = (ulong)(auVar25._0_4_ < 0.0) << 5 | 0x80;
      uVar20 = local_1428 ^ 0x20;
      uVar21 = local_1430 ^ 0x20;
      uVar19 = uVar16 ^ 0x20;
      auVar40._8_4_ = 0x80000000;
      auVar40._0_8_ = 0x8000000080000000;
      auVar40._12_4_ = 0x80000000;
      auVar40._16_4_ = 0x80000000;
      auVar40._20_4_ = 0x80000000;
      auVar40._24_4_ = 0x80000000;
      auVar40._28_4_ = 0x80000000;
      auVar38 = vxorps_avx512vl(auVar46,auVar40);
      auVar56 = ZEXT3264(auVar38);
      auVar37 = vxorps_avx512vl(auVar37,auVar40);
      auVar57 = ZEXT3264(auVar37);
      auVar37 = vxorps_avx512vl(auVar39,auVar40);
      auVar58 = ZEXT3264(auVar37);
      auVar37 = vbroadcastss_avx512vl(auVar26);
      auVar59 = ZEXT3264(auVar37);
      auVar37 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
      auVar60 = ZEXT3264(auVar37);
      auVar26 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar61 = ZEXT1664(auVar26);
      auVar26 = vmovddup_avx512vl(ZEXT816(0x8000000080000000));
      auVar62 = ZEXT1664(auVar26);
      auVar26 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
      auVar63 = ZEXT1664(auVar26);
      auVar26 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar64 = ZEXT1664(auVar26);
      local_1418 = context;
      local_1468 = uVar19;
      local_1460 = uVar21;
      local_1458 = uVar20;
      local_1450 = uVar16;
      do {
        if (local_1420 == stack) {
          return;
        }
        uVar18 = local_1420[-1].ptr;
        local_1420 = local_1420 + -1;
        do {
          if ((uVar18 & 8) == 0) {
            auVar37 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar18 + 0x40 + local_1428),auVar56._0_32_,
                                 auVar53._0_32_);
            auVar39 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar18 + 0x40 + local_1430),auVar57._0_32_,
                                 auVar54._0_32_);
            auVar37 = vpmaxsd_avx2(auVar37,auVar39);
            auVar39 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar18 + 0x40 + uVar16),auVar58._0_32_,
                                 auVar55._0_32_);
            auVar39 = vpmaxsd_avx512vl(auVar39,auVar59._0_32_);
            auVar37 = vpmaxsd_avx2(auVar37,auVar39);
            auVar39 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar18 + 0x40 + uVar20),auVar56._0_32_,
                                 auVar53._0_32_);
            auVar38 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar18 + 0x40 + uVar21),auVar57._0_32_,
                                 auVar54._0_32_);
            auVar39 = vpminsd_avx2(auVar39,auVar38);
            auVar38 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar18 + 0x40 + uVar19),auVar58._0_32_,
                                 auVar55._0_32_);
            auVar38 = vpminsd_avx512vl(auVar38,auVar60._0_32_);
            auVar39 = vpminsd_avx2(auVar39,auVar38);
            uVar12 = vpcmpd_avx512vl(auVar37,auVar39,2);
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)(byte)uVar12);
          }
          if ((uVar18 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar22 = 4;
            }
            else {
              uVar17 = uVar18 & 0xfffffffffffffff0;
              lVar15 = 0;
              for (uVar18 = unaff_R12; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000)
              {
                lVar15 = lVar15 + 1;
              }
              iVar22 = 0;
              for (uVar14 = unaff_R12 - 1 & unaff_R12; uVar18 = *(ulong *)(uVar17 + lVar15 * 8),
                  uVar14 != 0; uVar14 = uVar14 - 1 & uVar14) {
                local_1420->ptr = uVar18;
                local_1420 = local_1420 + 1;
                lVar15 = 0;
                for (uVar18 = uVar14; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000)
                {
                  lVar15 = lVar15 + 1;
                }
              }
            }
          }
          else {
            iVar22 = 6;
          }
        } while (iVar22 == 0);
        if (iVar22 == 6) {
          iVar22 = 0;
          local_1410 = (ulong)((uint)uVar18 & 0xf) - 8;
          bVar23 = local_1410 != 0;
          if (bVar23) {
            uVar18 = uVar18 & 0xfffffffffffffff0;
            scene = local_1418->scene;
            uVar17 = 0;
            do {
              lVar15 = uVar17 * 0x50;
              ppfVar4 = (scene->vertices).items;
              pfVar5 = ppfVar4[*(uint *)(uVar18 + 0x30 + lVar15)];
              pfVar6 = ppfVar4[*(uint *)(uVar18 + 0x34 + lVar15)];
              pfVar7 = ppfVar4[*(uint *)(uVar18 + 0x38 + lVar15)];
              pfVar8 = ppfVar4[*(uint *)(uVar18 + 0x3c + lVar15)];
              auVar25 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar18 + lVar15)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar18 + 8 + lVar15)));
              auVar26 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar18 + lVar15)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar18 + 8 + lVar15)));
              auVar36 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar18 + 4 + lVar15)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar18 + 0xc + lVar15)));
              auVar24 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar18 + 4 + lVar15)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar18 + 0xc + lVar15)));
              auVar31 = vunpcklps_avx(auVar26,auVar24);
              auVar29 = vunpcklps_avx(auVar25,auVar36);
              auVar30 = vunpckhps_avx(auVar25,auVar36);
              auVar25 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar18 + 0x10 + lVar15)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar18 + 0x18 + lVar15)));
              auVar26 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar18 + 0x10 + lVar15)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar18 + 0x18 + lVar15)));
              auVar36 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar18 + 0x14 + lVar15)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar18 + 0x1c + lVar15)));
              auVar24 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar18 + 0x14 + lVar15)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar18 + 0x1c + lVar15)));
              auVar34 = vunpcklps_avx(auVar26,auVar24);
              auVar28 = vunpcklps_avx(auVar25,auVar36);
              auVar24 = vunpckhps_avx(auVar25,auVar36);
              auVar36 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar18 + 0x20 + lVar15)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar18 + 0x28 + lVar15)));
              auVar26 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar18 + 0x20 + lVar15)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar18 + 0x28 + lVar15)));
              auVar35 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar18 + 0x24 + lVar15)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar18 + 0x2c + lVar15)));
              auVar25 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar6 + *(uint *)(uVar18 + 0x24 + lVar15)),
                                      *(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar18 + 0x2c + lVar15)));
              auVar27 = vunpcklps_avx(auVar26,auVar25);
              auVar32 = vunpcklps_avx(auVar36,auVar35);
              puVar1 = (undefined8 *)(uVar18 + 0x30 + lVar15);
              local_1398 = *puVar1;
              uStack_1390 = puVar1[1];
              auVar35 = vunpckhps_avx(auVar36,auVar35);
              puVar1 = (undefined8 *)(uVar18 + 0x40 + lVar15);
              local_13a8 = *puVar1;
              uStack_13a0 = puVar1[1];
              auVar26 = vsubps_avx(auVar29,auVar28);
              auVar24 = vsubps_avx(auVar30,auVar24);
              auVar25 = vsubps_avx(auVar31,auVar34);
              auVar36 = vsubps_avx(auVar32,auVar29);
              auVar35 = vsubps_avx(auVar35,auVar30);
              auVar34 = vsubps_avx(auVar27,auVar31);
              auVar27._0_4_ = auVar24._0_4_ * auVar34._0_4_;
              auVar27._4_4_ = auVar24._4_4_ * auVar34._4_4_;
              auVar27._8_4_ = auVar24._8_4_ * auVar34._8_4_;
              auVar27._12_4_ = auVar24._12_4_ * auVar34._12_4_;
              local_1308 = vfmsub231ps_fma(auVar27,auVar35,auVar25);
              auVar32._0_4_ = auVar25._0_4_ * auVar36._0_4_;
              auVar32._4_4_ = auVar25._4_4_ * auVar36._4_4_;
              auVar32._8_4_ = auVar25._8_4_ * auVar36._8_4_;
              auVar32._12_4_ = auVar25._12_4_ * auVar36._12_4_;
              local_12f8 = vfmsub231ps_fma(auVar32,auVar34,auVar26);
              auVar33._0_4_ = auVar26._0_4_ * auVar35._0_4_;
              auVar33._4_4_ = auVar26._4_4_ * auVar35._4_4_;
              auVar33._8_4_ = auVar26._8_4_ * auVar35._8_4_;
              auVar33._12_4_ = auVar26._12_4_ * auVar35._12_4_;
              uVar2 = *(undefined4 *)&(ray->dir).field_0;
              auVar51._4_4_ = uVar2;
              auVar51._0_4_ = uVar2;
              auVar51._8_4_ = uVar2;
              auVar51._12_4_ = uVar2;
              uVar2 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
              auVar52._4_4_ = uVar2;
              auVar52._0_4_ = uVar2;
              auVar52._8_4_ = uVar2;
              auVar52._12_4_ = uVar2;
              auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[2]));
              uVar2 = *(undefined4 *)&(ray->org).field_0;
              auVar28._4_4_ = uVar2;
              auVar28._0_4_ = uVar2;
              auVar28._8_4_ = uVar2;
              auVar28._12_4_ = uVar2;
              auVar28 = vsubps_avx512vl(auVar29,auVar28);
              local_12e8 = vfmsub231ps_fma(auVar33,auVar36,auVar24);
              uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar29._4_4_ = uVar2;
              auVar29._0_4_ = uVar2;
              auVar29._8_4_ = uVar2;
              auVar29._12_4_ = uVar2;
              auVar29 = vsubps_avx512vl(auVar30,auVar29);
              uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar30._4_4_ = uVar2;
              auVar30._0_4_ = uVar2;
              auVar30._8_4_ = uVar2;
              auVar30._12_4_ = uVar2;
              auVar30 = vsubps_avx512vl(auVar31,auVar30);
              auVar31 = vmulps_avx512vl(auVar52,auVar30);
              auVar31 = vfmsub231ps_avx512vl(auVar31,auVar29,auVar27);
              auVar32 = vmulps_avx512vl(auVar27,auVar28);
              auVar32 = vfmsub231ps_avx512vl(auVar32,auVar30,auVar51);
              auVar33 = vmulps_avx512vl(auVar51,auVar29);
              auVar33 = vfmsub231ps_avx512vl(auVar33,auVar28,auVar52);
              auVar27 = vmulps_avx512vl(local_12e8,auVar27);
              auVar27 = vfmadd231ps_avx512vl(auVar27,local_12f8,auVar52);
              auVar27 = vfmadd231ps_avx512vl(auVar27,local_1308,auVar51);
              local_1358 = vandps_avx512vl(auVar27,auVar61._0_16_);
              auVar34 = vmulps_avx512vl(auVar34,auVar33);
              auVar35 = vfmadd231ps_avx512vl(auVar34,auVar32,auVar35);
              auVar36 = vfmadd231ps_avx512vl(auVar35,auVar31,auVar36);
              auVar35 = vandps_avx512vl(auVar27,auVar62._0_16_);
              uVar47 = auVar35._0_4_;
              local_1388._0_4_ = (float)(uVar47 ^ auVar36._0_4_);
              uVar48 = auVar35._4_4_;
              local_1388._4_4_ = (float)(uVar48 ^ auVar36._4_4_);
              uVar49 = auVar35._8_4_;
              local_1388._8_4_ = (float)(uVar49 ^ auVar36._8_4_);
              uVar50 = auVar35._12_4_;
              local_1388._12_4_ = (float)(uVar50 ^ auVar36._12_4_);
              auVar25 = vmulps_avx512vl(auVar25,auVar33);
              auVar24 = vfmadd231ps_avx512vl(auVar25,auVar24,auVar32);
              auVar26 = vfmadd231ps_avx512vl(auVar24,auVar26,auVar31);
              local_1378._0_4_ = (float)(uVar47 ^ auVar26._0_4_);
              local_1378._4_4_ = (float)(uVar48 ^ auVar26._4_4_);
              local_1378._8_4_ = (float)(uVar49 ^ auVar26._8_4_);
              local_1378._12_4_ = (float)(uVar50 ^ auVar26._12_4_);
              auVar26 = auVar63._0_16_;
              uVar12 = vcmpps_avx512vl(local_1388,auVar26,5);
              uVar9 = vcmpps_avx512vl(local_1378,auVar26,5);
              uVar10 = vcmpps_avx512vl(auVar27,auVar26,4);
              auVar26._0_4_ = local_1378._0_4_ + local_1388._0_4_;
              auVar26._4_4_ = local_1378._4_4_ + local_1388._4_4_;
              auVar26._8_4_ = local_1378._8_4_ + local_1388._8_4_;
              auVar26._12_4_ = local_1378._12_4_ + local_1388._12_4_;
              uVar11 = vcmpps_avx512vl(auVar26,local_1358,2);
              local_1347 = (byte)uVar12 & (byte)uVar9 & (byte)uVar10 & (byte)uVar11;
              if (local_1347 != 0) {
                auVar45._0_4_ = local_12e8._0_4_ * auVar30._0_4_;
                auVar45._4_4_ = local_12e8._4_4_ * auVar30._4_4_;
                auVar45._8_4_ = local_12e8._8_4_ * auVar30._8_4_;
                auVar45._12_4_ = local_12e8._12_4_ * auVar30._12_4_;
                auVar26 = vfmadd213ps_fma(auVar29,local_12f8,auVar45);
                auVar26 = vfmadd213ps_fma(auVar28,local_1308,auVar26);
                local_1368._0_4_ = (float)(uVar47 ^ auVar26._0_4_);
                local_1368._4_4_ = (float)(uVar48 ^ auVar26._4_4_);
                local_1368._8_4_ = (float)(uVar49 ^ auVar26._8_4_);
                local_1368._12_4_ = (float)(uVar50 ^ auVar26._12_4_);
                uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar34._4_4_ = uVar2;
                auVar34._0_4_ = uVar2;
                auVar34._8_4_ = uVar2;
                auVar34._12_4_ = uVar2;
                auVar26 = vmulps_avx512vl(local_1358,auVar34);
                fVar41 = ray->tfar;
                auVar31._4_4_ = fVar41;
                auVar31._0_4_ = fVar41;
                auVar31._8_4_ = fVar41;
                auVar31._12_4_ = fVar41;
                auVar24 = vmulps_avx512vl(local_1358,auVar31);
                uVar12 = vcmpps_avx512vl(local_1368,auVar24,2);
                uVar9 = vcmpps_avx512vl(auVar26,local_1368,1);
                local_1347 = (byte)uVar12 & (byte)uVar9 & local_1347;
                if (local_1347 != 0) {
                  auVar26 = vrcp14ps_avx512vl(local_1358);
                  auVar24 = vfnmadd213ps_avx512vl(local_1358,auVar26,auVar64._0_16_);
                  auVar26 = vfmadd132ps_fma(auVar24,auVar26,auVar26);
                  fVar41 = auVar26._0_4_;
                  fVar42 = auVar26._4_4_;
                  fVar43 = auVar26._8_4_;
                  fVar44 = auVar26._12_4_;
                  local_1318[0] = fVar41 * local_1368._0_4_;
                  local_1318[1] = fVar42 * local_1368._4_4_;
                  local_1318[2] = fVar43 * local_1368._8_4_;
                  local_1318[3] = fVar44 * local_1368._12_4_;
                  local_1338[0] = fVar41 * local_1388._0_4_;
                  local_1338[1] = fVar42 * local_1388._4_4_;
                  local_1338[2] = fVar43 * local_1388._8_4_;
                  local_1338[3] = fVar44 * local_1388._12_4_;
                  local_1328._0_4_ = fVar41 * local_1378._0_4_;
                  local_1328._4_4_ = fVar42 * local_1378._4_4_;
                  local_1328._8_4_ = fVar43 * local_1378._8_4_;
                  local_1328._12_4_ = fVar44 * local_1378._12_4_;
                  local_1480 = (ulong)local_1347;
                  do {
                    auVar26 = auVar63._0_16_;
                    local_1438 = 0;
                    for (uVar16 = local_1480; (uVar16 & 1) == 0;
                        uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                      local_1438 = local_1438 + 1;
                    }
                    h.geomID = *(uint *)((long)&local_1398 + local_1438 * 4);
                    local_1440 = (scene->geometries).items[h.geomID].ptr;
                    if ((local_1440->mask & ray->mask) == 0) {
                      local_1480 = local_1480 ^ 1L << (local_1438 & 0x3f);
                      bVar13 = true;
                    }
                    else {
                      local_1470 = local_1418->args;
                      if ((local_1470->filter == (RTCFilterFunctionN)0x0) &&
                         (local_1440->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar13 = false;
                      }
                      else {
                        local_12d8 = auVar60._0_32_;
                        local_12b8 = auVar59._0_32_;
                        local_1298 = auVar58._0_32_;
                        local_1278 = auVar57._0_32_;
                        local_1258 = auVar56._0_32_;
                        local_1238 = auVar55._0_32_;
                        local_1218 = auVar54._0_32_;
                        local_11f8 = auVar53._0_32_;
                        uVar16 = (ulong)(uint)((int)local_1438 * 4);
                        h.u = *(float *)((long)local_1338 + uVar16);
                        h.v = *(float *)(local_1328 + uVar16);
                        args.context = local_1418->user;
                        h.primID = *(uint *)((long)&local_13a8 + uVar16);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_1308 + uVar16);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_12f8 + uVar16);
                        h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_12e8 + uVar16);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        fVar41 = ray->tfar;
                        ray->tfar = *(float *)((long)local_1318 + uVar16);
                        local_1474 = -1;
                        args.valid = &local_1474;
                        args.geometryUserPtr = local_1440->userPtr;
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        args.ray = (RTCRayN *)ray;
                        if ((local_1440->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*local_1440->occlusionFilterN)(&args), *args.valid != 0)) {
                          if (local_1470->filter != (RTCFilterFunctionN)0x0) {
                            if (((local_1470->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((local_1440->field_8).field_0x2 & 0x40) != 0)) {
                              (*local_1470->filter)(&args);
                            }
                            if (*args.valid == 0) goto LAB_00722013;
                          }
                          bVar13 = false;
                        }
                        else {
LAB_00722013:
                          ray->tfar = fVar41;
                          local_1480 = local_1480 ^ 1L << (local_1438 & 0x3f);
                          bVar13 = true;
                        }
                        auVar53 = ZEXT3264(local_11f8);
                        auVar54 = ZEXT3264(local_1218);
                        auVar55 = ZEXT3264(local_1238);
                        auVar56 = ZEXT3264(local_1258);
                        auVar57 = ZEXT3264(local_1278);
                        auVar58 = ZEXT3264(local_1298);
                        auVar59 = ZEXT3264(local_12b8);
                        auVar60 = ZEXT3264(local_12d8);
                        auVar24 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar61 = ZEXT1664(auVar24);
                        auVar24 = vmovddup_avx512vl(ZEXT816(0x8000000080000000));
                        auVar62 = ZEXT1664(auVar24);
                        auVar26 = vxorps_avx512vl(auVar26,auVar26);
                        auVar63 = ZEXT1664(auVar26);
                        auVar26 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar64 = ZEXT1664(auVar26);
                      }
                    }
                    if (!bVar13) {
                      uVar16 = local_1450;
                      uVar19 = local_1468;
                      uVar20 = local_1458;
                      uVar21 = local_1460;
                      if (bVar23) {
                        ray->tfar = -INFINITY;
                        iVar22 = 3;
                      }
                      goto LAB_007220ea;
                    }
                  } while (local_1480 != 0);
                }
              }
              uVar17 = uVar17 + 1;
              bVar23 = uVar17 < local_1410;
              uVar16 = local_1450;
              uVar19 = local_1468;
              uVar20 = local_1458;
              uVar21 = local_1460;
            } while (uVar17 != local_1410);
          }
        }
LAB_007220ea:
      } while (iVar22 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }